

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::updateAtoms(RigidBody *this,int frame)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppAVar4;
  undefined4 in_ESI;
  long in_RDI;
  RotMat3x3d a;
  Vector3d pos;
  DirectionalAtom *dAtom;
  Vector3d apos;
  Vector3d ref;
  uint i;
  Vector<double,_3U> *in_stack_fffffffffffffe58;
  Vector<double,_3U> *in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  StuntDouble *in_stack_fffffffffffffe78;
  SquareMatrix3<double> *in_stack_fffffffffffffe88;
  SquareMatrix3<double> *in_stack_fffffffffffffe90;
  SquareMatrix3<double> *in_stack_fffffffffffffe98;
  undefined1 local_130 [92];
  int in_stack_ffffffffffffff2c;
  Vector3d *in_stack_ffffffffffffff30;
  StuntDouble *in_stack_ffffffffffffff38;
  uint local_10;
  
  Vector3<double>::Vector3((Vector3<double> *)0x27de80);
  Vector3<double>::Vector3((Vector3<double> *)0x27de8d);
  StuntDouble::getPos(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  StuntDouble::getA(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  local_10 = 0;
  while( true ) {
    uVar2 = (ulong)local_10;
    sVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128));
    if (sVar3 <= uVar2) break;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x158),(ulong)local_10);
    StuntDouble::body2Lab
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe60,
               (Vector3<double> *)in_stack_fffffffffffffe58);
    OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_10);
    StuntDouble::setPos((StuntDouble *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                        ,(Vector3d *)in_stack_fffffffffffffe68,
                        (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_10);
    bVar1 = Atom::isDirectional((Atom *)0x27dfd2);
    in_stack_fffffffffffffe74 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe74);
    if (bVar1) {
      ppAVar4 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                          ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                           (in_RDI + 0x128),(ulong)local_10);
      in_stack_fffffffffffffe68 = *ppAVar4;
      if (in_stack_fffffffffffffe68 == (value_type)0x0) {
        in_stack_fffffffffffffe58 = (Vector<double,_3U> *)0x0;
      }
      else {
        in_stack_fffffffffffffe58 =
             (Vector<double,_3U> *)
             __dynamic_cast(in_stack_fffffffffffffe68,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
      }
      in_stack_fffffffffffffe60 = in_stack_fffffffffffffe58;
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI + 0x170),(ulong)local_10);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffe88);
      OpenMD::operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      (**(code **)((long)((Vector<double,_3U> *)in_stack_fffffffffffffe58->data_)->data_[0] + 0x20))
                (in_stack_fffffffffffffe58,local_130,in_ESI);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27e0d2);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27e0dc);
    }
    local_10 = local_10 + 1;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27e143);
  return;
}

Assistant:

void RigidBody::updateAtoms(int frame) {
    unsigned int i;
    Vector3d ref;
    Vector3d apos;
    DirectionalAtom* dAtom;
    Vector3d pos = getPos(frame);
    RotMat3x3d a = getA(frame);

    for (i = 0; i < atoms_.size(); i++) {
      ref = body2Lab(refCoords_[i], frame);

      apos = pos + ref;

      atoms_[i]->setPos(apos, frame);

      if (atoms_[i]->isDirectional()) {
        dAtom = dynamic_cast<DirectionalAtom*>(atoms_[i]);
        dAtom->setA(refOrients_[i].transpose() * a, frame);
      }
    }
  }